

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O0

void FAudio_OPERATIONSET_QueueSetChannelVolumes
               (FAudioVoice *voice,uint32_t Channels,float *pVolumes,uint32_t OperationSet)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  void *pvVar2;
  undefined8 in_RDX;
  uint in_ESI;
  long *in_RDI;
  FAudio_OPERATIONSET_Operation *op;
  undefined4 in_stack_fffffffffffffff0;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x135347);
  pFVar1 = QueueOperation((FAudioVoice *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                          (FAudio_OPERATIONSET_Type)((ulong)in_RDX >> 0x20),(uint32_t)in_RDX);
  (pFVar1->Data).SetEffectParameters.EffectIndex = in_ESI;
  pvVar2 = (void *)(**(code **)(*in_RDI + 0xb8))((ulong)in_ESI << 2);
  (pFVar1->Data).SetEffectParameters.pParameters = pvVar2;
  SDL_memcpy((pFVar1->Data).SetEffectParameters.pParameters,in_RDX,(ulong)in_ESI << 2);
  FAudio_PlatformUnlockMutex((FAudioMutex)0x1353bc);
  return;
}

Assistant:

void FAudio_OPERATIONSET_QueueSetChannelVolumes(
	FAudioVoice *voice,
	uint32_t Channels,
	const float *pVolumes,
	uint32_t OperationSet
) {
	FAudio_OPERATIONSET_Operation *op;

	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	op = QueueOperation(
		voice,
		FAUDIOOP_SETCHANNELVOLUMES,
		OperationSet
	);

	op->Data.SetChannelVolumes.Channels = Channels;
	op->Data.SetChannelVolumes.pVolumes = voice->audio->pMalloc(
		sizeof(float) * Channels
	);
	FAudio_memcpy(
		op->Data.SetChannelVolumes.pVolumes,
		pVolumes,
		sizeof(float) * Channels
	);

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}